

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall SQCompilation::CheckerVisitor::checkSameOperands(CheckerVisitor *this,BinExpr *expr)

{
  bool bVar1;
  TreeOp TVar2;
  LiteralKind LVar3;
  Node *this_00;
  Node *lhs;
  LiteralExpr *pLVar4;
  char *pcVar5;
  BinExpr *in_RSI;
  CheckerVisitor *in_RDI;
  Expr *rr;
  Expr *ll;
  Expr *r;
  Expr *l;
  Expr *in_stack_ffffffffffffffb8;
  
  if ((in_RDI->effectsOnly & 1U) == 0) {
    BinExpr::lhs(in_RSI);
    BinExpr::rhs(in_RSI);
    TVar2 = Node::op((Node *)in_RSI);
    bVar1 = isSuspiciousSameOperandsBinaryOp(TVar2);
    if (bVar1) {
      this_00 = &deparen(in_stack_ffffffffffffffb8)->super_Node;
      lhs = &deparen(in_stack_ffffffffffffffb8)->super_Node;
      bVar1 = NodeEqualChecker::check((NodeEqualChecker *)this_00,lhs,(Node *)in_RDI);
      if (bVar1) {
        TVar2 = Node::op(this_00);
        if (TVar2 == TO_LITERAL) {
          pLVar4 = Expr::asLiteral((Expr *)this_00);
          LVar3 = LiteralExpr::kind(pLVar4);
          if (LVar3 == LK_FLOAT) {
            return;
          }
          pLVar4 = Expr::asLiteral((Expr *)this_00);
          LVar3 = LiteralExpr::kind(pLVar4);
          if (LVar3 == LK_INT) {
            return;
          }
        }
        TVar2 = Node::op((Node *)in_RSI);
        pcVar5 = treeopStr(TVar2);
        report(in_RDI,(Node *)in_RSI,0x47,pcVar5);
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkSameOperands(const BinExpr *expr) {

  if (effectsOnly)
    return;

  const Expr *l = expr->lhs();
  const Expr *r = expr->rhs();

  if (isSuspiciousSameOperandsBinaryOp(expr->op())) {
    const Expr *ll = deparen(l);
    const Expr *rr = deparen(r);

    if (_equalChecker.check(ll, rr)) {
      if (ll->op() != TO_LITERAL || (ll->asLiteral()->kind() != LK_FLOAT && ll->asLiteral()->kind() != LK_INT)) { // -V522
        report(expr, DiagnosticsId::DI_SAME_OPERANDS, treeopStr(expr->op()));
      }
    }
  }
}